

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereMinMaxOptEarlyOut(Vdbe *v,WhereInfo *pWInfo)

{
  long in_RSI;
  int i;
  WhereLevel *pInner;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar1;
  
  if (((*(byte *)(in_RSI + 0x44) >> 2 & 1) != 0) && (*(char *)(in_RSI + 0x41) != '\0')) {
    uVar1 = (uint)*(byte *)(in_RSI + 0x40);
    do {
      uVar1 = uVar1 - 1;
      if ((int)uVar1 < 0) {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
        ;
        return;
      }
    } while ((*(uint *)(*(long *)(in_RSI + (long)(int)uVar1 * 0x70 + 0x3b8) + 0x30) & 4) == 0);
    sqlite3VdbeGoto((Vdbe *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereMinMaxOptEarlyOut(Vdbe *v, WhereInfo *pWInfo){
  WhereLevel *pInner;
  int i;
  if( !pWInfo->bOrderedInnerLoop ) return;
  if( pWInfo->nOBSat==0 ) return;
  for(i=pWInfo->nLevel-1; i>=0; i--){
    pInner = &pWInfo->a[i];
    if( (pInner->pWLoop->wsFlags & WHERE_COLUMN_IN)!=0 ){
      sqlite3VdbeGoto(v, pInner->addrNxt);
      return;
    }
  }
  sqlite3VdbeGoto(v, pWInfo->iBreak);
}